

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2e6623f::DescriptorImpl::ToStringSubScriptHelper
          (DescriptorImpl *this,SigningProvider *arg,string *ret,StringType type,
          DescriptorCache *cache)

{
  pointer puVar1;
  DescriptorImpl *pDVar2;
  int iVar3;
  long lVar4;
  pointer puVar5;
  long in_FS_OFFSET;
  bool bVar6;
  bool bVar7;
  string tmp;
  char *local_58;
  size_type local_50;
  char local_48;
  undefined7 uStack_47;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = (this->m_subdescriptor_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_subdescriptor_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = puVar5 == puVar1;
  if (!bVar7) {
    lVar4 = 0;
    do {
      bVar6 = lVar4 != 0;
      lVar4 = lVar4 + -1;
      if (bVar6) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (ret,",");
      }
      local_58 = &local_48;
      local_50 = 0;
      local_48 = '\0';
      pDVar2 = (puVar5->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
               .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>._M_head_impl;
      iVar3 = (*(pDVar2->super_Descriptor)._vptr_Descriptor[0x13])
                        (pDVar2,arg,&local_58,(ulong)type,cache);
      if ((char)iVar3 == '\0') {
        if (local_58 != &local_48) {
          operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
        }
        break;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (ret,local_58,local_50);
      if (local_58 != &local_48) {
        operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
      }
      if ((char)iVar3 == '\0') break;
      puVar5 = puVar5 + 1;
      bVar7 = puVar5 == puVar1;
    } while (!bVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

virtual bool ToStringSubScriptHelper(const SigningProvider* arg, std::string& ret, const StringType type, const DescriptorCache* cache = nullptr) const
    {
        size_t pos = 0;
        for (const auto& scriptarg : m_subdescriptor_args) {
            if (pos++) ret += ",";
            std::string tmp;
            if (!scriptarg->ToStringHelper(arg, tmp, type, cache)) return false;
            ret += tmp;
        }
        return true;
    }